

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

PolymorphicInlineCache * __thiscall
Js::FunctionBody::CreateNewPolymorphicInlineCache
          (FunctionBody *this,uint index,PropertyId propertyId,InlineCache *inlineCache)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  PolymorphicInlineCache *pPVar4;
  undefined4 *puVar5;
  Type *type;
  InlineCache *pIVar6;
  uint indexInPolymorphicCache;
  PolymorphicInlineCache *polymorphicInlineCache;
  InlineCache *inlineCache_local;
  PropertyId propertyId_local;
  uint index_local;
  FunctionBody *this_local;
  
  pPVar4 = GetPolymorphicInlineCache(this,index);
  if (pPVar4 != (PolymorphicInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1907,"(GetPolymorphicInlineCache(index) == nullptr)",
                                "GetPolymorphicInlineCache(index) == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar3 = GetRootObjectLoadInlineCacheStart(this);
  if ((uVar3 <= index) ||
     (bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,PolymorphicInlineCachePhase), bVar2)) {
    this_local = (FunctionBody *)0x0;
  }
  else {
    this_local = (FunctionBody *)CreatePolymorphicInlineCache(this,index,4);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,PolymorphicInlineCachePhase);
    if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
      DumpFullFunctionName(this);
      Output::Print(L": New PIC, index = %d, size = %d\n",(ulong)index,4);
    }
    type = InlineCache::GetType(inlineCache);
    uVar3 = PolymorphicInlineCache::GetInlineCacheIndexForType
                      ((PolymorphicInlineCache *)this_local,type);
    scriptContext = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
    pIVar6 = PolymorphicInlineCache::GetInlineCaches((PolymorphicInlineCache *)this_local);
    InlineCache::CopyTo(inlineCache,propertyId,scriptContext,pIVar6 + uVar3);
    PolymorphicInlineCache::UpdateInlineCachesFillInfo
              ((PolymorphicInlineCache *)this_local,uVar3,true);
  }
  return (PolymorphicInlineCache *)this_local;
}

Assistant:

PolymorphicInlineCache * FunctionBody::CreateNewPolymorphicInlineCache(uint index, PropertyId propertyId, InlineCache * inlineCache)
    {
        Assert(GetPolymorphicInlineCache(index) == nullptr);
        // Only create polymorphic inline caches for non-root inline cache indexes
        if (index < GetRootObjectLoadInlineCacheStart()
#if DBG
            && !PHASE_OFF1(Js::PolymorphicInlineCachePhase)
#endif
            )
        {
            PolymorphicInlineCache * polymorphicInlineCache = CreatePolymorphicInlineCache(index, MinPolymorphicInlineCacheSize);
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (PHASE_VERBOSE_TRACE1(Js::PolymorphicInlineCachePhase))
            {
                this->DumpFullFunctionName();
                Output::Print(_u(": New PIC, index = %d, size = %d\n"), index, MinPolymorphicInlineCacheSize);
            }

#endif
#if PHASE_PRINT_INTRUSIVE_TESTTRACE1
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
            PHASE_PRINT_INTRUSIVE_TESTTRACE1(
                Js::PolymorphicInlineCachePhase,
                _u("TestTrace PIC:  New, Function %s (%s), 0x%x, index = %d, size = %d\n"), this->GetDisplayName(), this->GetDebugNumberSet(debugStringBuffer), polymorphicInlineCache, index, MinPolymorphicInlineCacheSize);

            uint indexInPolymorphicCache = polymorphicInlineCache->GetInlineCacheIndexForType(inlineCache->GetType());
            inlineCache->CopyTo(propertyId, m_scriptContext, &(polymorphicInlineCache->GetInlineCaches()[indexInPolymorphicCache]));
            polymorphicInlineCache->UpdateInlineCachesFillInfo(indexInPolymorphicCache, true /*set*/);

            return polymorphicInlineCache;
        }
        return nullptr;
    }